

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::compute_order::
local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
          *slv,bit_array *x)

{
  bool bVar1;
  int iVar2;
  int k;
  
  if (slv->m == 0) {
    iVar2 = 0;
  }
  else {
    k = 0;
    iVar2 = 0;
    do {
      bVar1 = is_valid_constraint<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
                        (slv,k,x);
      iVar2 = iVar2 + (uint)!bVar1;
      k = k + 1;
    } while (k != slv->m);
  }
  return iVar2;
}

Assistant:

int local_compute_violated_constraints(const Solver& slv, const Xtype& x)
    {
        int remaining = 0;
        for (int k = 0; k != slv.m; ++k)
            if (!is_valid_constraint(slv, k, x))
                ++remaining;

        return remaining;
    }